

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

char * base64(void *binaryData,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uchar BYTE2;
  uchar BYTE1;
  uchar BYTE0;
  int pad;
  int modulusLen;
  int byteNo;
  int rc;
  char *res;
  uchar *bin;
  int *flen_local;
  int len_local;
  void *binaryData_local;
  
  modulusLen = 0;
  iVar4 = (len % 3 & 1U) * 2 + ((int)(len % 3 & 2U) >> 1);
  *flen = ((len + iVar4) * 4) / 3;
  binaryData_local = malloc((long)(*flen + 1));
  if (binaryData_local == (void *)0x0) {
    puts("ERROR: base64 could not allocate enough memory.");
    puts("I must stop because I could not get enough");
    binaryData_local = (void *)0x0;
  }
  else {
    for (pad = 0; pad <= len + -3; pad = pad + 3) {
      bVar1 = *(byte *)((long)binaryData + (long)pad);
      bVar2 = *(byte *)((long)binaryData + (long)(pad + 1));
      bVar3 = *(byte *)((long)binaryData + (long)(pad + 2));
      *(char *)((long)binaryData_local + (long)modulusLen) = b64[(int)(uint)bVar1 >> 2];
      *(char *)((long)binaryData_local + (long)(modulusLen + 1)) =
           b64[(int)((bVar1 & 3) * 0x10 + ((int)(uint)bVar2 >> 4))];
      iVar5 = modulusLen + 3;
      *(char *)((long)binaryData_local + (long)(modulusLen + 2)) =
           b64[(int)((bVar2 & 0xf) * 4 + ((int)(uint)bVar3 >> 6))];
      modulusLen = modulusLen + 4;
      *(char *)((long)binaryData_local + (long)iVar5) = b64[(int)(bVar3 & 0x3f)];
    }
    if (iVar4 == 2) {
      *(char *)((long)binaryData_local + (long)modulusLen) =
           b64[(int)(uint)*(byte *)((long)binaryData + (long)pad) >> 2];
      *(char *)((long)binaryData_local + (long)(modulusLen + 1)) =
           b64[(int)((*(byte *)((long)binaryData + (long)pad) & 3) << 4)];
      iVar4 = modulusLen + 3;
      *(undefined1 *)((long)binaryData_local + (long)(modulusLen + 2)) = 0x3d;
      modulusLen = modulusLen + 4;
      *(undefined1 *)((long)binaryData_local + (long)iVar4) = 0x3d;
    }
    else if (iVar4 == 1) {
      *(char *)((long)binaryData_local + (long)modulusLen) =
           b64[(int)(uint)*(byte *)((long)binaryData + (long)pad) >> 2];
      *(char *)((long)binaryData_local + (long)(modulusLen + 1)) =
           b64[(int)((*(byte *)((long)binaryData + (long)pad) & 3) * 0x10 +
                    ((int)(uint)*(byte *)((long)binaryData + (long)(pad + 1)) >> 4))];
      iVar4 = modulusLen + 3;
      *(char *)((long)binaryData_local + (long)(modulusLen + 2)) =
           b64[(int)((*(byte *)((long)binaryData + (long)(pad + 1)) & 0xf) << 2)];
      modulusLen = modulusLen + 4;
      *(undefined1 *)((long)binaryData_local + (long)iVar4) = 0x3d;
    }
    *(undefined1 *)((long)binaryData_local + (long)modulusLen) = 0;
  }
  return (char *)binaryData_local;
}

Assistant:

char* base64(const void* binaryData, int len, int *flen) {
	const unsigned char* bin = (const unsigned char*) binaryData;
	char* res;

	int rc = 0; // result counter
	int byteNo; // I need this after the loop

	int modulusLen = len % 3;
	int pad = ((modulusLen & 1) << 1) + ((modulusLen & 2) >> 1); // 2 gives 1 and 1 gives 2, but 0 gives 0.

	*flen = 4 * (len + pad) / 3;
	res = (char*) malloc(*flen + 1); // and one for the null
	if (!res) {
		puts("ERROR: base64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (byteNo = 0; byteNo <= len - 3; byteNo += 3) {
		unsigned char BYTE0 = bin[byteNo];
		unsigned char BYTE1 = bin[byteNo + 1];
		unsigned char BYTE2 = bin[byteNo + 2];
		res[rc++] = b64[BYTE0 >> 2];
		res[rc++] = b64[((0x3 & BYTE0) << 4) + (BYTE1 >> 4)];
		res[rc++] = b64[((0x0f & BYTE1) << 2) + (BYTE2 >> 6)];
		res[rc++] = b64[0x3f & BYTE2];
	}

	if (pad == 2) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[(0x3 & bin[byteNo]) << 4];
		res[rc++] = '=';
		res[rc++] = '=';
	} else if (pad == 1) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[((0x3 & bin[byteNo]) << 4) + (bin[byteNo + 1] >> 4)];
		res[rc++] = b64[(0x0f & bin[byteNo + 1]) << 2];
		res[rc++] = '=';
	}

	res[rc] = 0; // NULL TERMINATOR! ;)
	return res;
}